

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elsa.h
# Opt level: O1

size_t __thiscall
frozen::
unordered_set<C_A_T_C_H_T_E_S_T_6()::some_enum,2ul,frozen::elsa<C_A_T_C_H_T_E_S_T_6()::some_enum>,std::equal_to<C_A_T_C_H_T_E_S_T_6()::some_enum>>
::count<C_A_T_C_H_T_E_S_T_6()::some_enum>
          (unordered_set<some_enum,_2UL,_frozen::elsa<some_enum>,_std::equal_to<some_enum>_> *this,
          some_enum *key)

{
  some_enum sVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  
  sVar1 = *key;
  uVar3 = (this->tables_).first_seed_ ^ (long)(int)sVar1;
  uVar3 = uVar3 * 0x200000 + ~uVar3;
  uVar3 = (uVar3 >> 0x18 ^ uVar3) * 0x109;
  uVar2 = ((uint)(uVar3 >> 0xe) ^ (uint)uVar3) * 0x15;
  uVar3 = (this->tables_).first_table_.data_[(uVar2 >> 0x1c ^ uVar2) & 3].value_;
  if ((long)uVar3 < 0) {
    uVar3 = uVar3 ^ (long)(int)sVar1;
    uVar3 = uVar3 * 0x200000 + ~uVar3;
    uVar3 = (uVar3 >> 0x18 ^ uVar3) * 0x109;
    uVar2 = ((uint)(uVar3 >> 0xe) ^ (uint)uVar3) * 0x15;
    uVar3 = (this->tables_).second_table_.data_[(uVar2 >> 0x1c ^ uVar2) & 3];
  }
  if ((uVar3 == 2) || ((this->keys_).data_[uVar3] != sVar1)) {
    lVar4 = 8;
  }
  else {
    lVar4 = uVar3 << 2;
  }
  return (ulong)(lVar4 != 8);
}

Assistant:

constexpr std::size_t operator()(T const &value, std::size_t seed) const {
    std::size_t key = seed ^ static_cast<std::size_t>(value);
    key = (~key) + (key << 21); // key = (key << 21) - key - 1;
    key = key ^ (key >> 24);
    key = (key + (key << 3)) + (key << 8); // key * 265
    key = key ^ (key >> 14);
    key = (key + (key << 2)) + (key << 4); // key * 21
    key = key ^ (key >> 28);
    key = key + (key << 31);
    return key;
  }